

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O2

void __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::
customize<viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>>>
          (rt_latex_translator<viennamath::rt_expression_interface<double>> *this,
          rt_function_symbol<viennamath::rt_expression_interface<double>_> *e,string *output)

{
  byte bVar1;
  ostream *poVar2;
  byte bVar3;
  undefined8 *puVar4;
  
  bVar3 = 0;
  for (puVar4 = *(undefined8 **)this; puVar4 != *(undefined8 **)(this + 8); puVar4 = puVar4 + 1) {
    bVar1 = (**(code **)(*(long *)*puVar4 + 0x10))((long *)*puVar4,e,output);
    bVar3 = bVar3 | bVar1;
  }
  if ((bVar3 & 1) != 0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: Cannot customize LaTeX translator for ");
  poVar2 = operator<<(poVar2,e);
  poVar2 = std::operator<<(poVar2," (no suitable processor found)");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void customize(ExpressionType const & e, std::string output)
      {
        bool found = false;
        for (typename ProcessorArray::const_iterator it = processors_.begin();
                                                     it != processors_.end();
                                                   ++it)
        {
          found |= (*it)->customize(&e, output);
        }

        if (!found)
          std::cerr << "Warning: Cannot customize LaTeX translator for " << e << " (no suitable processor found)" << std::endl;
        //variable_strings_[x.id()] = output;
      }